

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O2

SharedTyPtr __thiscall mir::inst::Variable::type(Variable *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long in_RSI;
  SharedTyPtr SVar2;
  __shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  shared_ptr<mir::types::Ty> local_28;
  
  if (*(char *)(in_RSI + 0x18) == '\x01') {
    std::__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_38,(__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 8));
    std::make_shared<mir::types::PtrTy,std::shared_ptr<mir::types::Ty>&>(&local_28);
    _Var1._M_pi = local_28.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    local_28.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_Displayable)._vptr_Displayable =
         (_func_int **)
         local_28.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var1._M_pi;
    local_28.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_28.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
    _Var1._M_pi = extraout_RDX;
  }
  else {
    std::__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 8));
    _Var1._M_pi = extraout_RDX_00;
  }
  SVar2.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  SVar2.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedTyPtr)SVar2.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

types::SharedTyPtr type() const {
    if (is_memory_var) {
      return types::new_ptr_ty(ty);
    } else {
      return ty;
    }
  }